

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

char * __thiscall google::protobuf::internal::LongSooRep::elements(LongSooRep *this)

{
  char *pcVar1;
  
  pcVar1 = (char *)(this->elements_int & 0xfffffffffffffff8);
  if (pcVar1 != (char *)0x0) {
    return pcVar1;
  }
  elements();
}

Assistant:

char* elements() const {
    auto ret = reinterpret_cast<char*>(elements_int & kSooPtrMask);
    ABSL_DCHECK_NE(ret, nullptr);
    return ret;
  }